

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_create_type.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PhysicalCreateType::GetData
          (PhysicalCreateType *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  ClientContext *pCVar1;
  int iVar2;
  pointer pGVar3;
  pointer pCVar4;
  Catalog *this_00;
  type info;
  LogicalType local_30;
  
  iVar2 = (*(this->super_PhysicalOperator)._vptr_PhysicalOperator[0x21])();
  if ((char)iVar2 != '\0') {
    pGVar3 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator->(&(this->super_PhysicalOperator).sink_state);
    LogicalType::ENUM(&local_30,(Vector *)(pGVar3 + 1),
                      pGVar3[2].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
                      __align);
    pCVar4 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
             operator->(&this->info);
    LogicalType::operator=(&pCVar4->type,&local_30);
    LogicalType::~LogicalType(&local_30);
  }
  pCVar1 = context->client;
  pCVar4 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
           operator->(&this->info);
  this_00 = Catalog::GetCatalog(pCVar1,&(pCVar4->super_CreateInfo).catalog);
  pCVar1 = context->client;
  info = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
         operator*(&this->info);
  Catalog::CreateType(this_00,pCVar1,info);
  return FINISHED;
}

Assistant:

SourceResultType PhysicalCreateType::GetData(ExecutionContext &context, DataChunk &chunk,
                                             OperatorSourceInput &input) const {
	if (IsSink()) {
		D_ASSERT(info->type == LogicalType::INVALID);
		auto &g_sink_state = sink_state->Cast<CreateTypeGlobalState>();
		info->type = LogicalType::ENUM(g_sink_state.result, g_sink_state.size);
	}

	auto &catalog = Catalog::GetCatalog(context.client, info->catalog);
	catalog.CreateType(context.client, *info);
	return SourceResultType::FINISHED;
}